

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainClient.cpp
# Opt level: O2

void ReceiveMsgHandler(Client **client)

{
  string err;
  
  do {
    (*((*client)->super_TCP)._vptr_TCP[2])(*client,0);
  } while( true );
}

Assistant:

void ReceiveMsgHandler(Client **client) {
    while (true) {
        try {
            (*client)->Receive(0);
        }
        catch (std::string err) {
            std::cout << "[?] " << err << std::endl;
        }
    }

    (*client)->Close();
}